

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# okim6258.c
# Opt level: O3

void okim6258_update(void *param,UINT32 samples,DEV_SMPL **outputs)

{
  byte bVar1;
  ushort uVar2;
  DEV_SMPL *pDVar3;
  DEV_SMPL *pDVar4;
  uint uVar5;
  byte bVar6;
  byte bVar7;
  DEV_SMPL DVar8;
  byte bVar9;
  ulong uVar10;
  undefined2 uVar11;
  DEV_SMPL DVar12;
  short sVar13;
  uint uVar14;
  uint uVar15;
  
  pDVar3 = *outputs;
  pDVar4 = outputs[1];
  if (((*(byte *)((long)param + 8) & 2) == 0) || (*(char *)((long)param + 0x38) != '\0')) {
    if (samples != 0) {
      uVar10 = 0;
      do {
        pDVar3[uVar10] = 0;
        pDVar4[uVar10] = 0;
        uVar10 = uVar10 + 1;
      } while (samples != uVar10);
    }
  }
  else {
    bVar6 = *(byte *)((long)param + 0x17);
    if (samples != 0) {
      uVar2 = *(ushort *)((long)param + 0x1a);
      bVar1 = *(byte *)((long)param + 0x2b);
      bVar9 = *(byte *)((long)param + 0x2a);
      uVar10 = 0;
      do {
        if (bVar6 == 0) {
          if (bVar9 == 0) {
            bVar9 = *(byte *)((long)param + 0x29) + 0x10;
            *(undefined1 *)((long)param + 0x16) =
                 *(undefined1 *)((long)param + (ulong)(*(byte *)((long)param + 0x29) >> 4) + 0x20);
            bVar7 = bVar9 & 0x7f;
            *(byte *)((long)param + 0x29) = bVar7;
            if (bVar7 >> 4 == (bVar9 & 0xf)) {
              *(undefined1 *)((long)param + 0x2a) = 1;
              bVar9 = 1;
            }
            else {
              bVar9 = 0;
            }
            goto LAB_00165f24;
          }
          if (-1 < (char)bVar9) {
            bVar9 = bVar9 + 1;
            *(byte *)((long)param + 0x2a) = bVar9;
            goto LAB_00165fcc;
          }
LAB_00165fdc:
          bVar9 = bVar9 - 1;
          *(byte *)((long)param + 0x2a) = bVar9;
          uVar5 = *(short *)((long)param + 0x1c) * 0xf;
          uVar15 = *(short *)((long)param + 0x1c) * 0xf + 0xf;
          if (-1 < (int)uVar5) {
            uVar15 = uVar5;
          }
          uVar15 = uVar15 >> 4;
          *(short *)((long)param + 0x1c) = (short)uVar15;
LAB_00166007:
          *(short *)((long)param + 0x2c) = (short)uVar15;
        }
        else {
          if (bVar9 < 2) {
LAB_00165f24:
            uVar14 = (uint)(*(byte *)((long)param + 0x16) >> (bVar6 & 0x1f));
            uVar15 = ((uint)(*(short *)((long)param + 0x1c) * 0xf5) >> 8) +
                     diff_lookup[(int)((int)*(short *)((long)param + 0x1e) << 4 | uVar14 & 0xf)];
            sVar13 = (short)uVar15;
            *(short *)((long)param + 0x1c) = sVar13;
            uVar5 = 0x7ff;
            if ((0x7ff < sVar13) || (uVar5 = 0xf800, sVar13 < -0x800)) {
              uVar15 = uVar5;
              *(short *)((long)param + 0x1c) = (short)uVar15;
            }
            sVar13 = *(short *)((long)param + 0x1e) + (short)index_shift[uVar14 & 7];
            *(short *)((long)param + 0x1e) = sVar13;
            uVar11 = 0x30;
            if (sVar13 < 0x31) {
              if (-1 < sVar13) goto LAB_00166007;
              uVar11 = 0;
            }
            *(undefined2 *)((long)param + 0x1e) = uVar11;
            goto LAB_00166007;
          }
LAB_00165fcc:
          if (bVar9 != 2) goto LAB_00165fdc;
          uVar15 = (uint)*(ushort *)((long)param + 0x2c);
          bVar9 = 2;
        }
        bVar6 = bVar6 ^ 4;
        DVar12 = (DEV_SMPL)(short)((uVar15 & uVar2) << 4);
        DVar8 = 0;
        if ((bVar1 & 2) == 0) {
          DVar8 = DVar12;
        }
        if ((bVar1 & 1) != 0) {
          DVar12 = 0;
        }
        pDVar3[uVar10] = DVar8;
        pDVar4[uVar10] = DVar12;
        uVar10 = uVar10 + 1;
      } while (samples != uVar10);
    }
    *(byte *)((long)param + 0x17) = bVar6;
  }
  return;
}

Assistant:

static void okim6258_update(void *param, UINT32 samples, DEV_SMPL **outputs)
{
	okim6258_state *chip = (okim6258_state *)param;
	DEV_SMPL *bufL = outputs[0];
	DEV_SMPL *bufR = outputs[1];
	UINT32 i;

	if ((chip->status & STATUS_PLAYING) && ! chip->Muted)
	{
		UINT8 nibble_shift = chip->nibble_shift;

		for (i = 0; i < samples; i++)
		{
			/* Compute the new amplitude and update the current step */
			int nibble;
			INT16 sample;
			
			if (! nibble_shift)
			{
				// 1st nibble - get data
				if (! chip->data_empty)
				{
					chip->data_in = chip->data_buf[chip->data_buf_pos >> 4];
					chip->data_buf_pos += 0x10;
					chip->data_buf_pos &= 0x7F;
					if ((chip->data_buf_pos >> 4) == (chip->data_buf_pos & 0x0F))
						chip->data_empty ++;
				}
				else
				{
					//chip->data_in = chip->data_in_last;
					if (chip->data_empty < 0x80)
						chip->data_empty ++;
				}
			}
			nibble = (chip->data_in >> nibble_shift) & 0xf;

			/* Output to the buffer */
			//sample = clock_adpcm(chip, nibble);
			if (chip->data_empty < 0x02)
			{
				sample = clock_adpcm(chip, nibble);
				chip->last_smpl = sample;
			}
			else
			{
				// Valley Bell: data_empty behaviour (loosely) ported from XM6
				if (chip->data_empty >= 0x02 + 0x01)
				{
					chip->data_empty -= 0x01;
					chip->signal = chip->signal * 15 / 16;
					chip->last_smpl = chip->signal;
				}
				sample = chip->last_smpl;
			}

			nibble_shift ^= 4;

			sample &= chip->output_mask;	// emulate DAC precision
			sample <<= 4;	// scale up to 16 bit
			bufL[i] = (chip->pan & 0x02) ? 0 : sample;
			bufR[i] = (chip->pan & 0x01) ? 0 : sample;
		}

		/* Update the parameters */
		chip->nibble_shift = nibble_shift;
	}
	else
	{
		/* Fill with 0 */
		for (i = 0; i < samples; i++)
		{
			bufL[i] = 0;
			bufR[i] = 0;
		}
	}
}